

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFields
          (Printer *this,UnknownFieldSet *unknown_fields,TextGenerator *generator)

{
  pointer pUVar1;
  _func_int *p_Var2;
  string *data;
  bool bVar3;
  _func_int **pp_Var4;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  char *pcVar5;
  long lVar6;
  long lVar7;
  Hex hex;
  Hex hex_00;
  undefined8 uStack_c0;
  UnknownFieldSet embedded_unknown_fields;
  string field_number;
  AlphaNum local_60;
  
  lVar6 = 8;
  lVar7 = 0;
  do {
    pUVar1 = (unknown_fields->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(unknown_fields->fields_).
                            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 4) <=
        lVar7) {
      return;
    }
    strings::AlphaNum::AlphaNum(&local_60,*(int *)((long)pUVar1 + lVar6 + -8));
    StrCat_abi_cxx11_(&field_number,(protobuf *)&local_60,a);
    switch(*(undefined4 *)((long)pUVar1 + lVar6 + -4)) {
    case 0:
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                (generator,field_number._M_dataplus._M_p,field_number._M_string_length);
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": ",2);
      strings::AlphaNum::AlphaNum(&local_60,*(unsigned_long *)((long)&pUVar1->number_ + lVar6));
      StrCat_abi_cxx11_((string *)&embedded_unknown_fields,(protobuf *)&local_60,a_00);
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                (generator,
                 embedded_unknown_fields.fields_.
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 embedded_unknown_fields.fields_.
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      break;
    case 1:
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                (generator,field_number._M_dataplus._M_p,field_number._M_string_length);
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": 0x",4);
      hex_00.value = (ulong)*(uint *)((long)&pUVar1->number_ + lVar6);
      hex_00._8_8_ = 8;
      strings::AlphaNum::AlphaNum(&local_60,hex_00);
      StrCat_abi_cxx11_((string *)&embedded_unknown_fields,(protobuf *)&local_60,a_02);
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                (generator,
                 embedded_unknown_fields.fields_.
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 embedded_unknown_fields.fields_.
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      break;
    case 2:
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                (generator,field_number._M_dataplus._M_p,field_number._M_string_length);
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": 0x",4);
      hex._8_8_ = 0x10;
      hex.value = *(uint64 *)((long)&pUVar1->number_ + lVar6);
      strings::AlphaNum::AlphaNum(&local_60,hex);
      StrCat_abi_cxx11_((string *)&embedded_unknown_fields,(protobuf *)&local_60,a_01);
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                (generator,
                 embedded_unknown_fields.fields_.
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 embedded_unknown_fields.fields_.
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      break;
    case 3:
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                (generator,field_number._M_dataplus._M_p,field_number._M_string_length);
      data = *(string **)((long)&pUVar1->number_ + lVar6);
      embedded_unknown_fields.fields_.
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      embedded_unknown_fields.fields_.
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      embedded_unknown_fields.fields_.
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((data->_M_string_length == 0) ||
         (bVar3 = UnknownFieldSet::ParseFromString(&embedded_unknown_fields,data), !bVar3)) {
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": \"",3);
        CEscape((string *)&local_60,data);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_60.piece_data_,local_60.piece_size_);
        std::__cxx11::string::~string((string *)&local_60);
        pp_Var4 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator + 5;
        pcVar5 = "\"\n";
        if (this->single_line_mode_ != false) {
          pcVar5 = "\" ";
        }
      }
      else {
        p_Var2 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5];
        if (this->single_line_mode_ == true) {
          (*p_Var2)(generator," { ",3);
        }
        else {
          (*p_Var2)(generator," {\n",3);
          (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
        }
        PrintUnknownFields(this,&embedded_unknown_fields,generator);
        pp_Var4 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator;
        if (this->single_line_mode_ == true) {
          pp_Var4 = pp_Var4 + 5;
          pcVar5 = "} ";
        }
        else {
          (*pp_Var4[3])(generator);
          pp_Var4 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator + 5;
          pcVar5 = "}\n";
        }
      }
      (**pp_Var4)(generator,pcVar5,2);
      UnknownFieldSet::~UnknownFieldSet(&embedded_unknown_fields);
      goto switchD_0026ea0c_default;
    case 4:
      (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                (generator,field_number._M_dataplus._M_p,field_number._M_string_length);
      p_Var2 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5];
      if (this->single_line_mode_ == true) {
        (*p_Var2)(generator," { ",3);
      }
      else {
        (*p_Var2)(generator," {\n",3);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
      }
      PrintUnknownFields(this,*(UnknownFieldSet **)((long)&pUVar1->number_ + lVar6),generator);
      pp_Var4 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator;
      if (this->single_line_mode_ == true) {
        pcVar5 = "} {z} ";
      }
      else {
        (*pp_Var4[3])(generator);
        pp_Var4 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator;
        pcVar5 = "$0  }\n";
      }
      pcVar5 = pcVar5 + 4;
      uStack_c0 = 2;
      goto LAB_0026ecc1;
    default:
      goto switchD_0026ea0c_default;
    }
    std::__cxx11::string::~string((string *)&embedded_unknown_fields);
    pp_Var4 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator;
    pcVar5 = "\n";
    if (this->single_line_mode_ != false) {
      pcVar5 = " ";
    }
    uStack_c0 = 1;
LAB_0026ecc1:
    (*pp_Var4[5])(generator,pcVar5,uStack_c0);
switchD_0026ea0c_default:
    std::__cxx11::string::~string((string *)&field_number);
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 0x10;
  } while( true );
}

Assistant:

void TextFormat::Printer::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields, TextGenerator* generator) const {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);
    std::string field_number = StrCat(field.number());

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        generator->PrintString(field_number);
        generator->PrintLiteral(": ");
        generator->PrintString(StrCat(field.varint()));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      case UnknownField::TYPE_FIXED32: {
        generator->PrintString(field_number);
        generator->PrintLiteral(": 0x");
        generator->PrintString(
            StrCat(strings::Hex(field.fixed32(), strings::ZERO_PAD_8)));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_FIXED64: {
        generator->PrintString(field_number);
        generator->PrintLiteral(": 0x");
        generator->PrintString(
            StrCat(strings::Hex(field.fixed64(), strings::ZERO_PAD_16)));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_LENGTH_DELIMITED: {
        generator->PrintString(field_number);
        const std::string& value = field.length_delimited();
        UnknownFieldSet embedded_unknown_fields;
        if (!value.empty() && embedded_unknown_fields.ParseFromString(value)) {
          // This field is parseable as a Message.
          // So it is probably an embedded message.
          if (single_line_mode_) {
            generator->PrintLiteral(" { ");
          } else {
            generator->PrintLiteral(" {\n");
            generator->Indent();
          }
          PrintUnknownFields(embedded_unknown_fields, generator);
          if (single_line_mode_) {
            generator->PrintLiteral("} ");
          } else {
            generator->Outdent();
            generator->PrintLiteral("}\n");
          }
        } else {
          // This field is not parseable as a Message.
          // So it is probably just a plain string.
          generator->PrintLiteral(": \"");
          generator->PrintString(CEscape(value));
          if (single_line_mode_) {
            generator->PrintLiteral("\" ");
          } else {
            generator->PrintLiteral("\"\n");
          }
        }
        break;
      }
      case UnknownField::TYPE_GROUP:
        generator->PrintString(field_number);
        if (single_line_mode_) {
          generator->PrintLiteral(" { ");
        } else {
          generator->PrintLiteral(" {\n");
          generator->Indent();
        }
        PrintUnknownFields(field.group(), generator);
        if (single_line_mode_) {
          generator->PrintLiteral("} ");
        } else {
          generator->Outdent();
          generator->PrintLiteral("}\n");
        }
        break;
    }
  }
}